

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O0

int16_t OPL3_EnvelopeCalcSin0(uint16_t phase,uint16_t envelope)

{
  ushort uVar1;
  ushort local_10;
  ushort local_e;
  uint16_t neg;
  uint16_t out;
  uint16_t envelope_local;
  uint16_t phase_local;
  
  local_10 = 0;
  if ((phase & 0x200) != 0) {
    local_10 = 0xffff;
  }
  if ((phase & 0x100) == 0) {
    local_e = logsinrom[(phase & 0x3ff) & 0xff];
  }
  else {
    local_e = logsinrom[(phase & 0x3ff) & 0xff ^ 0xff];
  }
  uVar1 = OPL3_EnvelopeCalcExp((uint)local_e + (uint)envelope * 8);
  return uVar1 ^ local_10;
}

Assistant:

static int16_t OPL3_EnvelopeCalcSin0(uint16_t phase, uint16_t envelope)
{
    uint16_t out = 0;
    uint16_t neg = 0;
    phase &= 0x3ff;
    if (phase & 0x200)
    {
        neg = 0xffff;
    }
    if (phase & 0x100)
    {
        out = logsinrom[(phase & 0xffu) ^ 0xffu];
    }
    else
    {
        out = logsinrom[phase & 0xffu];
    }
    return OPL3_EnvelopeCalcExp(out + (envelope << 3)) ^ neg;
}